

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O1

void summaryindex::doit(string *subfolder)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  string *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  FILE *pFVar6;
  _Base_ptr p_Var7;
  undefined8 extraout_RAX;
  _Rb_tree_color _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Base_ptr p_Var10;
  _Self __tmp;
  pointer pbVar11;
  bool bVar12;
  string filename;
  string s2;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  summary_id_file_id_to_offset;
  vector<int,_std::allocator<int>_> event_ids;
  value_type local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  local_98;
  vector<int,_std::allocator<int>_> local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::operator+(&local_d8,"work/",subfolder);
  std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_d8);
  iVar2 = std::__cxx11::string::compare((char *)&local_98);
  psVar1 = (string *)((long)&local_98._M_impl.super__Rb_tree_header._M_header + 8);
  if ((string *)local_98._M_impl._0_8_ != psVar1) {
    operator_delete((void *)local_98._M_impl._0_8_);
  }
  if (iVar2 != 0) {
    local_98._M_impl._0_8_ = psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    std::__cxx11::string::append((char *)&local_98);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_98);
    if ((string *)local_98._M_impl._0_8_ != psVar1) {
      operator_delete((void *)local_98._M_impl._0_8_);
    }
  }
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = 0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  __dirp = (string *)opendir(local_d8._M_dataplus._M_p);
  if (__dirp == (string *)0x0) {
    doit((summaryindex *)&local_d8);
    __dirp = psVar1;
LAB_00102ccb:
    doit((summaryindex *)&local_118);
  }
  else {
    while( true ) {
      paVar9 = &local_118.field_2;
      pdVar4 = readdir((DIR *)__dirp);
      local_118._M_dataplus._M_p = (pointer)paVar9;
      if (pdVar4 == (dirent *)0x0) break;
      sVar5 = strlen(pdVar4->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,pdVar4->d_name,pdVar4->d_name + sVar5);
      if (local_118._M_string_length < 5) {
        bVar12 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_118);
        iVar3 = std::__cxx11::string::compare((char *)local_50);
        bVar12 = iVar3 == 0;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      if (bVar12) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_d8._M_dataplus._M_p,
                   local_d8._M_dataplus._M_p + local_d8._M_string_length);
        std::__cxx11::string::append((char *)&local_f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_b8,&local_118);
        indexevents(&local_f8,&local_68,
                    (map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)&local_98,iVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        iVar2 = iVar2 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    std::__cxx11::string::append((char *)&local_118);
    pFVar6 = fopen(local_118._M_dataplus._M_p,"wb");
    if (pFVar6 == (FILE *)0x0) goto LAB_00102ccb;
    if (local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __dirp = (string *)0x104166;
      pbVar11 = local_b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        fprintf(pFVar6,"%s\n",(pbVar11->_M_dataplus)._M_p);
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 !=
               local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    fclose(pFVar6);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    pFVar6 = fopen(local_118._M_dataplus._M_p,"wb");
    if (pFVar6 != (FILE *)0x0) {
      if ((_Rb_tree_header *)local_98._M_impl.super__Rb_tree_header._M_header._M_left ==
          &local_98._M_impl.super__Rb_tree_header) {
        _Var8 = _S_red;
      }
      else {
        _Var8 = _S_red;
        p_Var7 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if ((int)_Var8 < (int)p_Var7[1]._M_color) {
            _Var8 = p_Var7[1]._M_color;
          }
          for (p_Var10 = p_Var7[1]._M_parent; p_Var10 != p_Var7[1]._M_left;
              p_Var10 = (_Base_ptr)&p_Var10->_M_parent) {
            fprintf(pFVar6,"%d, %d, %lld\n",(ulong)p_Var7[1]._M_color,
                    (ulong)*(uint *)&p_Var7[1].field_0x4,*(undefined8 *)p_Var10);
          }
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while ((_Rb_tree_header *)p_Var7 != &local_98._M_impl.super__Rb_tree_header);
      }
      fclose(pFVar6);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      std::__cxx11::string::append((char *)&local_f8);
      __dirp = &local_f8;
      std::__cxx11::string::operator=((string *)&local_118,(string *)__dirp);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      pFVar6 = fopen(local_118._M_dataplus._M_p,"wb");
      if (pFVar6 != (FILE *)0x0) {
        fprintf(pFVar6,"%d",(ulong)_Var8);
        fclose(pFVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar9) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::~_Rb_tree(&local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        return;
      }
      goto LAB_00102cdb;
    }
  }
  doit((summaryindex *)&local_118);
LAB_00102cdb:
  doit((summaryindex *)&local_118);
  if ((string *)local_98._M_impl._0_8_ != __dirp) {
    operator_delete((void *)local_98._M_impl._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void doit(const std::string& subfolder)
{	
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}

	std::vector<std::string> files;
	//std::map<int, std::vector<int>> summary_id_to_events;
	std::map<summary_keyz, std::vector<long long>> summary_id_file_id_to_offset;
	std::vector<int> event_ids;
	DIR* dir;
	struct dirent* ent;
	int file_index = 0;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				std::string s2 = path + ent->d_name;
				files.push_back(s);
				indexevents(s2, event_ids, summary_id_file_id_to_offset, file_index);
				file_index++;
			}
		}
	}
	else {
		fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
		exit(-1);
	}

	std::string filename =  path + "filelist.idx";
	FILE* fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  filename.c_str());
		exit(EXIT_FAILURE);
	}
	auto iter = files.begin();
	while (iter != files.end()) {
		fprintf(fout, "%s\n", iter->c_str());
		iter++;
	}

	fclose(fout);


	int max_summary_id = 0;
	filename = path + "summaries.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n", filename.c_str());
		exit(EXIT_FAILURE);
	}

	auto s_iter = summary_id_file_id_to_offset.begin();
	while (s_iter != summary_id_file_id_to_offset.end()) {
		if (s_iter->first.summary_id > max_summary_id) max_summary_id = s_iter->first.summary_id;
		auto v_iter = s_iter->second.begin();
		while (v_iter != s_iter->second.end()) {
			fprintf(fout, "%d, %d, %lld\n", s_iter->first.summary_id, s_iter->first.fileindex, *v_iter);
			v_iter++;
		}
		s_iter++;
	}
	fclose(fout);

	filename = path + "max_summary_id.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  filename.c_str());
		exit(EXIT_FAILURE);
	}
	fprintf(fout, "%d", max_summary_id);
	fclose(fout);
	
}